

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMeshControl::ConnectedInterfaceElements
          (TPZMHMeshControl *this,int64_t skeleton,pair<long,_long> *leftright,
          map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
          *intfaces)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  reference celside_00;
  TPZCompEl *__k;
  TPZGeoElSide *in_RCX;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  *in_RDX;
  pair<long,_long> *in_RSI;
  int64_t in_RDI;
  TPZMHMeshControl *unaff_retaddr;
  TPZInterfaceElement *intface;
  TPZCompElSide celneigh;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZCompElSide celside;
  iterator it2;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *loclist;
  iterator it;
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  ellist;
  size_t in_stack_000002b8;
  char *in_stack_000002c0;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  TPZGeoElSide *in_stack_fffffffffffffea0;
  TPZGeoElSide *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  TPZCompElSide *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  TPZInterfaceElement *local_130;
  undefined4 in_stack_fffffffffffffee0;
  TPZCompElSide local_d8;
  TPZGeoElSide local_c8;
  TPZGeoElSide local_b0;
  TPZCompElSide local_98;
  _Self local_88;
  _Self local_80;
  list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *local_78;
  _Self local_70;
  _Self local_68 [9];
  TPZGeoElSide *local_20;
  
  local_20 = in_RCX;
  std::
  map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
  ::map((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
         *)0x1e147f6);
  ConnectedElements(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
       ::begin((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  do {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
         ::end((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    bVar1 = std::operator!=(local_68,&local_70);
    if (!bVar1) {
      std::
      map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
      ::~map((map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
              *)0x1e14bb7);
      return;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
                           *)0x1e1486c);
    local_78 = &ppVar3->second;
    local_80._M_node =
         (_List_node_base *)
         std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::begin
                   ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)
                    CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    while( true ) {
      local_88._M_node =
           (_List_node_base *)
           std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>::end
                     ((list<TPZCompElSide,_std::allocator<TPZCompElSide>_> *)
                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      bVar1 = std::operator!=(&local_80,&local_88);
      if (!bVar1) break;
      celside_00 = std::_List_iterator<TPZCompElSide>::operator*
                             ((_List_iterator<TPZCompElSide> *)0x1e148cd);
      TPZCompElSide::TPZCompElSide(&local_98,celside_00);
      TPZCompElSide::Reference(in_stack_fffffffffffffeb8);
      TPZGeoElSide::Neighbour(in_stack_fffffffffffffea8);
      while (iVar2 = TPZGeoElSide::operator!=(&local_c8,&local_b0), iVar2 != 0) {
        TPZGeoElSide::Reference(in_stack_fffffffffffffea8);
        bVar1 = TPZCompElSide::operator_cast_to_bool(&local_d8);
        in_stack_fffffffffffffee0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee0);
        if (bVar1) {
          __k = TPZCompElSide::Element(&local_d8);
          if (__k == (TPZCompEl *)0x0) {
            local_130 = (TPZInterfaceElement *)0x0;
          }
          else {
            local_130 = (TPZInterfaceElement *)
                        __dynamic_cast(__k,&TPZCompEl::typeinfo,&TPZInterfaceElement::typeinfo,0);
          }
          if (local_130 != (TPZInterfaceElement *)0x0) {
            TPZInterfaceElement::LeftElementSide(local_130);
            in_stack_fffffffffffffec7 =
                 TPZCompElSide::operator==
                           ((TPZCompElSide *)
                            CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffeb8);
            if (!(bool)in_stack_fffffffffffffec7) {
              in_stack_fffffffffffffeb8 = TPZInterfaceElement::RightElementSide(local_130);
              in_stack_fffffffffffffeb7 =
                   TPZCompElSide::operator==
                             ((TPZCompElSide *)
                              CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffeb8);
              if (!(bool)in_stack_fffffffffffffeb7) goto LAB_01e14adf;
            }
            in_stack_fffffffffffffea0 = local_20;
            std::
            _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
                          *)0x1e14ab3);
            in_stack_fffffffffffffea8 =
                 (TPZGeoElSide *)
                 std::
                 map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
                 ::operator[]((map<long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>_>_>_>
                               *)CONCAT44(iVar2,in_stack_fffffffffffffee0),(key_type_conflict1 *)__k
                             );
            std::__cxx11::list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_>::
            push_back((list<TPZInterfaceElement_*,_std::allocator<TPZInterfaceElement_*>_> *)
                      CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                      (value_type *)in_stack_fffffffffffffea8);
            break;
          }
        }
LAB_01e14adf:
        TPZGeoElSide::Neighbour(in_stack_fffffffffffffea8);
        TPZGeoElSide::operator=
                  (in_stack_fffffffffffffea0,
                   (TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e14b0f);
      }
      in_stack_fffffffffffffe9c = TPZGeoElSide::operator==(&local_c8,&local_b0);
      if (in_stack_fffffffffffffe9c != 0) {
        pzinternal::DebugStopImpl(in_stack_000002c0,in_stack_000002b8);
      }
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e14b5a);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e14b67);
      std::_List_iterator<TPZCompElSide>::operator++(&local_80,0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>
                  *)in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  } while( true );
}

Assistant:

void TPZMHMeshControl::ConnectedInterfaceElements(int64_t skeleton, std::pair<int64_t,int64_t> &leftright, std::map<int64_t, std::list<TPZInterfaceElement *> > &intfaces)
{
    std::map<int64_t, std::list<TPZCompElSide> > ellist;
    ConnectedElements(skeleton, leftright, ellist);
    // neighbour to each element there is an interface element
    for (std::map<int64_t, std::list<TPZCompElSide> >::iterator it = ellist.begin(); it != ellist.end(); it++) {
        std::list<TPZCompElSide> &loclist = it->second;
        for (std::list<TPZCompElSide>::iterator it2 = loclist.begin(); it2 != loclist.end(); it2++) {
            TPZCompElSide celside = *it2;
            TPZGeoElSide gelside = celside.Reference();
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                TPZCompElSide celneigh = neighbour.Reference();
                if (celneigh) {
                    TPZInterfaceElement *intface = dynamic_cast<TPZInterfaceElement *>(celneigh.Element());
                    if (intface && (intface->LeftElementSide() == celside || intface->RightElementSide() == celside)) {
                        intfaces[it->first].push_back(intface);
                        break;
                    }
                }
                neighbour = neighbour.Neighbour();
            }
            if (neighbour == gelside) {
                DebugStop();
            }
        }
    }
}